

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>::
operator()(void *this,char *value_text,
          flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
          *x)

{
  bool bVar1;
  size_t sVar2;
  AssertionResult *other;
  flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  *in_RCX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  Matcher<const_phmap::flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_&>
  matcher;
  stringstream ss;
  StringMatchResultListener listener;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  MatcherBase<const_phmap::flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_&>
  local_360;
  stringstream local_348 [16];
  long local_338 [14];
  ios_base local_2c8 [264];
  MatchResultListener local_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  UnorderedElementsAreMatcher::operator_cast_to_Matcher
            ((Matcher<const_phmap::flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_&>
              *)&local_360,(UnorderedElementsAreMatcher *)value_text);
  local_1c0.stream_ = (ostream *)0x0;
  local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00322228;
  bVar1 = MatcherBase<const_phmap::flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_&>
          ::MatchAndExplain(&local_360,in_RCX,&local_1c0);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream(local_348);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"Value of: ",10);
    if (x == (flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
              *)0x0) {
      std::ios::clear((int)(ostream *)local_338 + (int)*(undefined8 *)(local_338[0] + -0x18));
    }
    else {
      sVar2 = strlen((char *)x);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,(char *)x,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"Expected: ",10);
    MatcherBase<const_phmap::flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_&>
    ::DescribeTo(&local_360,(ostream *)local_338);
    local_1c0.stream_ = local_1a0;
    local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_00322270;
    std::__cxx11::stringstream::stringstream(local_1b0);
    bVar1 = MatchPrintAndExplain<phmap::flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>const,phmap::flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>const&>
                      (in_RCX,(Matcher<const_phmap::flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_&>
                               *)&local_360,&local_1c0);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_338,
                 "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                 ,0x60);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"\n  Actual: ",0xb);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_338,local_390._M_dataplus._M_p,local_390._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<((AssertionResult *)local_370,&local_390);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if (local_368._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_368,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_368._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_00322270;
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
    std::__cxx11::stringstream::~stringstream(local_348);
    std::ios_base::~ios_base(local_2c8);
  }
  MatcherBase<const_phmap::flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>_&>
  ::~MatcherBase(&local_360);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }